

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_p.h
# Opt level: O2

QString * __thiscall
QLocaleData::DataRange::getData(QString *__return_storage_ptr__,DataRange *this,char16_t *table)

{
  if ((ulong)this->size == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QString::fromRawData(__return_storage_ptr__,table + this->offset,(ulong)this->size);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] QString getData(const char16_t *table) const
        {
            return size > 0
                ? QString::fromRawData(stringStart(table), stringSize())
                : QString();
        }